

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instruction
          (Impl *this,Block *bb,
          unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Op op;
  Id IVar1;
  pointer *__ptr;
  Id type_id;
  Id id;
  Id nan_id;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  Id local_68;
  undefined4 local_64;
  Op local_60;
  Id local_5c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id local_34;
  
  local_58._M_head_impl =
       (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
       _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  op = (local_58._M_head_impl)->opCode;
  IVar1 = (local_58._M_head_impl)->resultId;
  local_60 = (local_58._M_head_impl)->typeId;
  local_5c = IVar1;
  if ((((IVar1 == 0) || ((this->instruction_instrumentation).info.enabled != true)) ||
      ((this->instruction_instrumentation).info.type != FlushNaNToZero)) ||
     ((op == OpPhi ||
      ((this->builder).module.idToInstruction.
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_start[local_60]->opCode != OpTypeFloat)))) {
    (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58)
    ;
    if (local_58._M_head_impl != (Instruction *)0x0) {
      (*(local_58._M_head_impl)->_vptr_Instruction[1])();
    }
    local_58._M_head_impl = (Instruction *)0x0;
    if ((((this->instruction_instrumentation).info.enabled == true) && (op != OpPhi)) &&
       ((this->instruction_instrumentation).info.type == FullNanInf)) {
      add_instrumented_instruction(this,op,bb,IVar1);
    }
  }
  else {
    local_34 = (this->builder).uniqueId;
    IVar1 = local_34 + 1;
    local_34 = local_34 + 2;
    (this->builder).uniqueId = local_34;
    (local_58._M_head_impl)->resultId = IVar1;
    local_68 = spv::Builder::makeNullConstant(&this->builder,local_60);
    local_78._M_head_impl._0_4_ = spv::Builder::makeBoolType(&this->builder);
    local_64 = 0x9c;
    std::make_unique<spv::Instruction,unsigned_int&,unsigned_int,spv::Op>
              ((uint *)&local_70,&local_34,(Op *)&local_78);
    spv::Instruction::addIdOperand(local_70._M_head_impl,IVar1);
    local_64 = 0xa9;
    std::make_unique<spv::Instruction,unsigned_int&,unsigned_int&,spv::Op>
              ((uint *)&local_78,&local_5c,&local_60);
    spv::Instruction::addIdOperand(local_78._M_head_impl,local_34);
    spv::Instruction::addIdOperand(local_78._M_head_impl,local_68);
    spv::Instruction::addIdOperand(local_78._M_head_impl,IVar1);
    local_40._M_head_impl =
         (inst->_M_t).
         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    (inst->_M_t).super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
    _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40)
    ;
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl = (Instruction *)0x0;
    local_48._M_head_impl = local_70._M_head_impl;
    local_70._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48)
    ;
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = (Instruction *)0x0;
    local_50._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50)
    ;
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    local_50._M_head_impl = (Instruction *)0x0;
    if (local_78._M_head_impl != (Instruction *)0x0) {
      (*(local_78._M_head_impl)->_vptr_Instruction[1])();
    }
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*(local_70._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instruction(spv::Block *bb, std::unique_ptr<spv::Instruction> inst)
{
	spv::Op op = inst->getOpCode();
	spv::Id id = inst->getResultId();
	spv::Id type_id = inst->getTypeId();

	if (id != 0 && instruction_instrumentation.info.enabled &&
	    instruction_instrumentation.info.type == InstructionInstrumentationType::FlushNaNToZero &&
	    builder.getTypeClass(type_id) == spv::OpTypeFloat && op != spv::OpPhi)
	{
		// A bit special since we're rewriting the IDs.
		spv::Id new_id = builder.getUniqueId();
		spv::Id nan_id = builder.getUniqueId();
		inst->setResultId(new_id);

		spv::Id null_const = builder.makeNullConstant(type_id);
		auto is_nan = std::make_unique<spv::Instruction>(nan_id, builder.makeBoolType(), spv::OpIsNan);
		is_nan->addIdOperand(new_id);
		auto replaced = std::make_unique<spv::Instruction>(id, type_id, spv::OpSelect);
		replaced->addIdOperand(nan_id);
		replaced->addIdOperand(null_const);
		replaced->addIdOperand(new_id);

		bb->addInstruction(std::move(inst));
		bb->addInstruction(std::move(is_nan));
		bb->addInstruction(std::move(replaced));
	}
	else
	{
		bb->addInstruction(std::move(inst));

		// For Full instrumentation add everything, otherwise, we need specialized instrumentation.
		if (instruction_instrumentation.info.enabled &&
		    instruction_instrumentation.info.type == InstructionInstrumentationType::FullNanInf &&
		    op != spv::OpPhi)
		{
			add_instrumented_instruction(op, bb, id);
		}
	}
}